

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::killDuplicateEnd
          (InvocationInterlockPlacementPass *this,BasicBlock *block)

{
  char cVar1;
  Instruction *pIVar2;
  iterator __end2;
  code *pcVar3;
  undefined8 *puVar4;
  Instruction *pIVar5;
  iterator __begin2;
  undefined8 *puVar6;
  ulong uVar7;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> to_kill;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_90;
  _Any_data *local_88;
  undefined8 local_80;
  code *local_78;
  code *local_70;
  undefined8 *local_68;
  undefined8 *puStack_60;
  long local_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_48._M_unused._M_object = &local_68;
  local_68 = (undefined8 *)0x0;
  puStack_60 = (undefined8 *)0x0;
  local_58 = 0;
  local_88 = &local_48;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:114:22)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:114:22)>
             ::_M_manager;
  local_80 = 0;
  local_70 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  pIVar2 = (block->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar2 != (Instruction *)0x0) {
    local_90._M_head_impl = pIVar2;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:114:22)>
    ::_M_invoke(&local_48,&local_90._M_head_impl);
  }
  pIVar2 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pcVar3 = std::
           _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
           ::_M_manager;
  if ((pIVar2 != (Instruction *)0x0) &&
     ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar2 == (Instruction *)0x0) break;
      pIVar5 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_90._M_head_impl = pIVar2;
      if (local_78 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      if ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar5 = (Instruction *)0x0;
      }
      cVar1 = (*local_70)(&local_88,&local_90);
      pIVar2 = pIVar5;
    } while (cVar1 != '\0');
    pcVar3 = local_78;
    if (local_78 == (code *)0x0) goto LAB_0058d2e6;
  }
  (*pcVar3)(&local_88,&local_88,3);
LAB_0058d2e6:
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  uVar7 = (long)puStack_60 - (long)local_68;
  if (8 < uVar7) {
    puVar4 = puStack_60 + -1;
    puStack_60 = puVar4;
    for (puVar6 = local_68; puVar6 != puVar4; puVar6 = puVar6 + 1) {
      IRContext::KillInst((this->super_Pass).context_,(Instruction *)*puVar6);
    }
  }
  if (local_68 != (undefined8 *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  return 8 < uVar7;
}

Assistant:

bool InvocationInterlockPlacementPass::killDuplicateEnd(BasicBlock* block) {
  std::vector<Instruction*> to_kill;
  block->ForEachInst([&to_kill](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpEndInvocationInterlockEXT) {
      to_kill.push_back(inst);
    }
  });

  if (to_kill.size() <= 1) {
    return false;
  }

  to_kill.pop_back();

  for (Instruction* inst : to_kill) {
    context()->KillInst(inst);
  }

  return true;
}